

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O2

ZyanStatus
ZydisFormatterATTPrintMnemonic
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  int iVar1;
  ZydisBranchType ZVar2;
  ZydisDecodedOperand *pZVar3;
  ZyanStatus ZVar4;
  ZyanU32 ZVar5;
  ZydisShortString *pZVar6;
  long lVar7;
  ZydisLetterCase letter_case;
  ZyanString *destination;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x115,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x116,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x117,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context->instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("context->instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x118,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context->operands == (ZydisDecodedOperand *)0x0) {
    __assert_fail("context->operands",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x119,
                  "ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  pZVar6 = ZydisMnemonicGetStringWrapped(context->instruction->mnemonic);
  if (pZVar6 == (ZydisShortString *)0x0) {
    if (buffer->is_token_list == '\0') {
      ZVar4 = ZydisStringAppendShortCase
                        (&buffer->string,&STR_INVALID_MNEMONIC,formatter->case_mnemonic);
    }
    else {
      ZVar4 = ZydisFormatterBufferAppendPredefined
                        (buffer,(ZydisPredefinedToken *)&TOK_DATA_INVALID_MNEMONIC);
    }
    if ((int)ZVar4 < 0) {
      return ZVar4;
    }
  }
  else {
    if ((buffer->is_token_list != '\0') &&
       (ZVar4 = ZydisFormatterBufferAppend(buffer,'\x06'), (int)ZVar4 < 0)) {
      return ZVar4;
    }
    if (((context->instruction->meta).branch_type == ZYDIS_BRANCH_TYPE_FAR) &&
       (ZVar4 = ZydisStringAppendShortCase(&buffer->string,&STR_FAR_ATT,formatter->case_mnemonic),
       (int)ZVar4 < 0)) {
      return ZVar4;
    }
    destination = &buffer->string;
    ZVar4 = ZydisStringAppendShortCase(destination,pZVar6,formatter->case_mnemonic);
    if ((int)ZVar4 < 0) {
      return ZVar4;
    }
    for (lVar7 = 0; (ulong)context->instruction->operand_count_visible * 0x50 - lVar7 != 0;
        lVar7 = lVar7 + 0x50) {
      pZVar3 = context->operands;
      if ((*(int *)((long)&pZVar3->type + lVar7) == 2) &&
         ((iVar1 = *(int *)((long)&pZVar3->field_10 + lVar7), iVar1 == 1 || (iVar1 == 4)))) {
        ZVar5 = ZydisFormatterHelperGetExplicitSize
                          (formatter,context,(ZydisDecodedOperand *)(&pZVar3->id + lVar7));
        if (ZVar5 == 8) {
          pZVar6 = &STR_SIZE_8_ATT;
        }
        else if (ZVar5 == 0x200) {
          pZVar6 = &STR_SIZE_512_ATT;
        }
        else if (ZVar5 == 0x20) {
          pZVar6 = &STR_SIZE_32_ATT;
        }
        else if (ZVar5 == 0x40) {
          pZVar6 = &STR_SIZE_64_ATT;
        }
        else if (ZVar5 == 0x80) {
          pZVar6 = &STR_SIZE_128_ATT;
        }
        else if (ZVar5 == 0x100) {
          pZVar6 = &STR_SIZE_256_ATT;
        }
        else {
          if (ZVar5 != 0x10) break;
          pZVar6 = &STR_SIZE_16_ATT;
        }
        ZydisStringAppendShort(destination,pZVar6);
        break;
      }
    }
    if ((formatter->print_branch_size != '\0') &&
       (ZVar2 = (context->instruction->meta).branch_type, ZVar2 != ZYDIS_BRANCH_TYPE_NONE)) {
      if (ZVar2 == ZYDIS_BRANCH_TYPE_NEAR) {
        letter_case = formatter->case_mnemonic;
        pZVar6 = &STR_NEAR;
      }
      else {
        if (ZVar2 != ZYDIS_BRANCH_TYPE_SHORT) {
          return 0x80100004;
        }
        letter_case = formatter->case_mnemonic;
        pZVar6 = &STR_SHORT;
      }
      ZVar4 = ZydisStringAppendShortCase(destination,pZVar6,letter_case);
      return ZVar4;
    }
  }
  return 0x100000;
}

Assistant:

ZyanStatus ZydisFormatterATTPrintMnemonic(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(context->instruction);
    ZYAN_ASSERT(context->operands);

    const ZydisShortString* mnemonic = ZydisMnemonicGetStringWrapped(
        context->instruction->mnemonic);
    if (!mnemonic)
    {
        ZYDIS_BUFFER_APPEND_CASE(buffer, INVALID_MNEMONIC, formatter->case_mnemonic);
        return ZYAN_STATUS_SUCCESS;
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_MNEMONIC);
    if (context->instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_FAR)
    {
        ZYAN_CHECK(ZydisStringAppendShortCase(&buffer->string, &STR_FAR_ATT,
            formatter->case_mnemonic));
    }
    ZYAN_CHECK(ZydisStringAppendShortCase(&buffer->string, mnemonic, formatter->case_mnemonic));

    // Append operand-size suffix
    ZyanU32 size = 0;
    for (ZyanU8 i = 0; i < context->instruction->operand_count_visible; ++i)
    {
        const ZydisDecodedOperand* const operand = &context->operands[i];
        if ((operand->type == ZYDIS_OPERAND_TYPE_MEMORY) &&
            ((operand->mem.type == ZYDIS_MEMOP_TYPE_MEM) ||
             (operand->mem.type == ZYDIS_MEMOP_TYPE_VSIB)))
        {
            size = ZydisFormatterHelperGetExplicitSize(formatter, context, operand);
            break;
        }
    }

    switch (size)
    {
    case   8: ZydisStringAppendShort(&buffer->string, &STR_SIZE_8_ATT  ); break;
    case  16: ZydisStringAppendShort(&buffer->string, &STR_SIZE_16_ATT ); break;
    case  32: ZydisStringAppendShort(&buffer->string, &STR_SIZE_32_ATT ); break;
    case  64: ZydisStringAppendShort(&buffer->string, &STR_SIZE_64_ATT ); break;
    case 128: ZydisStringAppendShort(&buffer->string, &STR_SIZE_128_ATT); break;
    case 256: ZydisStringAppendShort(&buffer->string, &STR_SIZE_256_ATT); break;
    case 512: ZydisStringAppendShort(&buffer->string, &STR_SIZE_512_ATT); break;
    default:
        break;
    }

    if (formatter->print_branch_size)
    {
        switch (context->instruction->meta.branch_type)
        {
        case ZYDIS_BRANCH_TYPE_NONE:
            break;
        case ZYDIS_BRANCH_TYPE_SHORT:
            return ZydisStringAppendShortCase(&buffer->string, &STR_SHORT,
                formatter->case_mnemonic);
        case ZYDIS_BRANCH_TYPE_NEAR:
            return ZydisStringAppendShortCase(&buffer->string, &STR_NEAR,
                formatter->case_mnemonic);
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
    }

    return ZYAN_STATUS_SUCCESS;
}